

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

ConstantValue * __thiscall
(anonymous_namespace)::evalLogicalOp<bool,bool>
          (ConstantValue *__return_storage_ptr__,_anonymous_namespace_ *this,BinaryOperator op,
          bool *l,bool *r)

{
  char cVar1;
  logic_t lVar2;
  byte value;
  logic_error *this_00;
  undefined4 in_register_00000014;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar3 = (char *)CONCAT44(in_register_00000014,op);
  switch((int)this) {
  case 0x13:
    cVar1 = *pcVar3;
    value = (cVar1 != '\0' && (cVar1 != '@' && cVar1 != -0x80)) & *l;
    break;
  case 0x14:
    cVar1 = *pcVar3;
    value = (cVar1 != '\0' && (cVar1 != '@' && cVar1 != -0x80)) | *l;
    break;
  case 0x15:
    slang::SVInt::SVInt<bool,void>((SVInt *)&local_b8,(bool)*pcVar3);
    slang::SVInt::SVInt<bool,void>((SVInt *)&local_d8,*l);
    lVar2 = slang::SVInt::logicalImpl((SVInt *)&local_b8,(SVInt *)&local_d8);
    slang::SVInt::SVInt((SVInt *)&local_98,lVar2);
    goto LAB_003238a9;
  case 0x16:
    slang::SVInt::SVInt<bool,void>((SVInt *)&local_b8,(bool)*pcVar3);
    slang::SVInt::SVInt<bool,void>((SVInt *)&local_d8,*l);
    lVar2 = slang::SVInt::logicalEquiv((SVInt *)&local_b8,(SVInt *)&local_d8);
    slang::SVInt::SVInt((SVInt *)&local_98,lVar2);
LAB_003238a9:
    std::
    variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
    ::variant<slang::SVInt,void,void,slang::SVInt,void>
              ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                *)__return_storage_ptr__,(SVInt *)&local_98);
    slang::SVInt::~SVInt((SVInt *)&local_98);
    slang::SVInt::~SVInt((SVInt *)&local_d8);
    this_01 = &local_b8;
    goto LAB_00323916;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
               ,&local_d9);
    std::operator+(&local_38,&local_58,":");
    std::__cxx11::to_string(&local_78,0x2a);
    std::operator+(&local_d8,&local_38,&local_78);
    std::operator+(&local_b8,&local_d8,": ");
    std::operator+(&local_98,&local_b8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_98);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this_01 = &local_98;
  slang::SVInt::SVInt<bool,void>((SVInt *)this_01,(bool)value);
  std::
  variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
  ::variant<slang::SVInt,void,void,slang::SVInt,void>
            ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
              *)__return_storage_ptr__,(SVInt *)this_01);
LAB_00323916:
  slang::SVInt::~SVInt((SVInt *)this_01);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue evalLogicalOp(BinaryOperator op, const TL& l, const TR& r) {
    switch (op) {
        OP(LogicalAnd, SVInt(logic_t(l) && r));
        OP(LogicalOr, SVInt(logic_t(l) || r));
        OP(LogicalImplication, SVInt(SVInt::logicalImpl(l, r)));
        OP(LogicalEquivalence, SVInt(SVInt::logicalEquiv(l, r)));
        default:
            ASSUME_UNREACHABLE;
    }
}